

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

void cp_save_grow(CPState *cp,CPChar c)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = (cp->sb).sz;
  if (uVar1 < 0x4000) {
    pcVar2 = (char *)lj_mem_realloc(cp->L,(cp->sb).buf,uVar1,uVar1 * 2);
    (cp->sb).buf = pcVar2;
    (cp->sb).sz = uVar1 * 2;
    uVar1 = (cp->sb).n;
    (cp->sb).n = uVar1 + 1;
    pcVar2[uVar1] = (char)c;
    return;
  }
  cp_err(cp,LJ_ERR_XELEM);
}

Assistant:

static LJ_NOINLINE void cp_save_grow(CPState *cp, CPChar c)
{
  MSize newsize;
  if (cp->sb.sz >= CPARSE_MAX_BUF/2)
    cp_err(cp, LJ_ERR_XELEM);
  newsize = cp->sb.sz * 2;
  lj_str_resizebuf(cp->L, &cp->sb, newsize);
  cp->sb.buf[cp->sb.n++] = (char)c;
}